

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

Context * __thiscall aeron::archive::Context::controlRequestChannel(Context *this,string *value)

{
  ChannelUri uri;
  string local_c0;
  ChannelUri local_a0;
  
  ChannelUri::parse(&local_a0,value);
  std::__cxx11::to_string(&local_c0,(this->cfg_).controlTermBufferLength);
  ChannelUri::put(&local_a0,(string *)(anonymous_namespace)::TERM_LENGTH_PARAM_NAME_abi_cxx11_,
                  &local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::to_string(&local_c0,(this->cfg_).controlMtuLength);
  ChannelUri::put(&local_a0,(string *)(anonymous_namespace)::MTU_LENGTH_PARAM_NAME_abi_cxx11_,
                  &local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::to_string(&local_c0,(uint)(this->cfg_).controlTermBufferSparse);
  ChannelUri::put(&local_a0,(string *)(anonymous_namespace)::SPARSE_PARAM_NAME_abi_cxx11_,&local_c0)
  ;
  std::__cxx11::string::~string((string *)&local_c0);
  ChannelUri::toString_abi_cxx11_(&local_c0,&local_a0);
  std::__cxx11::string::operator=((string *)&this->controlRequestChannel_,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  ChannelUri::~ChannelUri(&local_a0);
  return this;
}

Assistant:

Context& Context::controlRequestChannel(const std::string& value) {
    ChannelUri uri = ChannelUri::parse(value);
    uri.put(TERM_LENGTH_PARAM_NAME, std::to_string(cfg_.controlTermBufferLength));
    uri.put(MTU_LENGTH_PARAM_NAME, std::to_string(cfg_.controlMtuLength));
    uri.put(SPARSE_PARAM_NAME, std::to_string(cfg_.controlTermBufferSparse));
    controlRequestChannel_ = uri.toString();
    return *this;
}